

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

ScriptFunctionWithInlineCache * __thiscall
Js::JavascriptLibrary::CreateScriptFunctionWithInlineCache
          (JavascriptLibrary *this,FunctionProxy *proxy)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  ScriptFunctionType *deferredPrototypeType;
  Recycler *pRVar5;
  undefined4 *puVar6;
  FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_> *this_00;
  FunctionWithComputedName<Js::ScriptFunctionWithInlineCache> *this_01;
  FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache> *this_02;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  deferredPrototypeType = FunctionProxy::EnsureDeferredPrototypeType(proxy);
  TVar1 = ((proxy->functionInfo).ptr)->attributes;
  if ((TVar1 & (HomeObj|ComputedName)) == None) {
    local_50 = (undefined1  [8])&ScriptFunctionWithInlineCache::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x191a;
    pRVar5 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00c00a22;
      *puVar6 = 0;
    }
    this_01 = (FunctionWithComputedName<Js::ScriptFunctionWithInlineCache> *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)133,false>
                        (pRVar5,0x70);
    if (this_01 == (FunctionWithComputedName<Js::ScriptFunctionWithInlineCache> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa70,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00c00a22;
      *puVar6 = 0;
    }
    ScriptFunctionWithInlineCache::ScriptFunctionWithInlineCache
              ((ScriptFunctionWithInlineCache *)this_01,proxy,deferredPrototypeType);
  }
  else {
    if ((~TVar1 & 0x2800000) == 0) {
      local_50 = (undefined1  [8])
                 &FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>>
                  ::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_766a001;
      data.filename._0_4_ = 0x1912;
      pRVar5 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00c00a22;
        *puVar6 = 0;
      }
      this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>
                 *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)133,false>
                             (pRVar5,0x80);
      if (this_00 ==
          (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_> *)
          0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa70,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00c00a22;
        *puVar6 = 0;
      }
      FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>_>::
      FunctionWithComputedName(this_00,proxy,deferredPrototypeType);
      return (ScriptFunctionWithInlineCache *)this_00;
    }
    if ((TVar1 >> 0x19 & 1) != 0) {
      local_50 = (undefined1  [8])&FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_766a001;
      data.filename._0_4_ = 0x1916;
      pRVar5 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00c00a22;
        *puVar6 = 0;
      }
      this_02 = (FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache> *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)133,false>
                          (pRVar5,0x78);
      if (this_02 == (FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa70,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00c00a22;
        *puVar6 = 0;
      }
      FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::FunctionWithHomeObj
                (this_02,proxy,deferredPrototypeType);
      return &this_02->super_ScriptFunctionWithInlineCache;
    }
    local_50 = (undefined1  [8])
               &FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x1918;
    pRVar5 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00c00a22;
      *puVar6 = 0;
    }
    this_01 = (FunctionWithComputedName<Js::ScriptFunctionWithInlineCache> *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)133,false>
                        (pRVar5,0x78);
    if (this_01 == (FunctionWithComputedName<Js::ScriptFunctionWithInlineCache> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa70,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00c00a22:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    FunctionWithComputedName<Js::ScriptFunctionWithInlineCache>::FunctionWithComputedName
              (this_01,proxy,deferredPrototypeType);
  }
  return &this_01->super_ScriptFunctionWithInlineCache;
}

Assistant:

ScriptFunctionWithInlineCache* JavascriptLibrary::CreateScriptFunctionWithInlineCache(FunctionProxy * proxy)
    {
        ScriptFunctionType* deferredPrototypeType = proxy->EnsureDeferredPrototypeType();
        FunctionInfo* functionInfo = proxy->GetFunctionInfo();
        if (functionInfo->HasComputedName() || functionInfo->HasHomeObj())
        {
            if (functionInfo->HasComputedName() && functionInfo->HasHomeObj())
            {
                return RecyclerNewWithInfoBits(this->GetRecycler(), (Memory::ObjectInfoBits)(EnumFunctionClass | Memory::FinalizableObjectBits), FunctionWithComputedName<FunctionWithHomeObj<ScriptFunctionWithInlineCache>>, proxy, deferredPrototypeType);
            }
            else if (functionInfo->HasHomeObj())
            {
                return RecyclerNewWithInfoBits(this->GetRecycler(), (Memory::ObjectInfoBits)(EnumFunctionClass | Memory::FinalizableObjectBits), FunctionWithHomeObj<ScriptFunctionWithInlineCache>, proxy, deferredPrototypeType);
            }
            return RecyclerNewWithInfoBits(this->GetRecycler(), (Memory::ObjectInfoBits)(EnumFunctionClass | Memory::FinalizableObjectBits), ScriptFunctionWithInlineCacheAndComputedName, proxy, deferredPrototypeType);
        }
        return RecyclerNewWithInfoBits(this->GetRecycler(), (Memory::ObjectInfoBits)(EnumFunctionClass | Memory::FinalizableObjectBits), ScriptFunctionWithInlineCache, proxy, deferredPrototypeType);
    }